

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,int32_t key,bool val,
               upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map_00;
  upb_Map *map;
  upb_MiniTableField field;
  upb_Arena *a_local;
  bool val_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *ppStack_10;
  int32_t key_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  
  stack0xffffffffffffffd4 = 0x37800000068;
  field.number_dont_copy_me__upb_internal_use_only = 0xc00b0019;
  field._4_8_ = a;
  a_local._3_1_ = val;
  a_local._4_4_ = key;
  ppStack_10 = msg;
  _upb_MiniTable_StrongReference_dont_copy_me__upb_internal_use_only
            (&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32BoolEntry_msg_init);
  map_00 = _upb_Message_GetOrCreateMutableMap
                     (&ppStack_10->base_dont_copy_me__upb_internal_use_only,
                      (upb_MiniTableField *)((long)&map + 4),4,1,(upb_Arena *)field._4_8_);
  uVar1 = _upb_Map_Insert(map_00,(void *)((long)&a_local + 4),4,(void *)((long)&a_local + 3),1,
                          (upb_Arena *)field._4_8_);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_bool_set(protobuf_test_messages_proto2_TestAllTypesProto2* msg, int32_t key, bool val, upb_Arena* a) {
  const upb_MiniTableField field = {104, UPB_SIZE(340, 888), 0, 25, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32BoolEntry_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}